

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.hpp
# Opt level: O2

void __thiscall
cs::compiler_type::build_line
          (compiler_type *this,deque<char,_std::allocator<char>_> *buff,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *ast,size_t line_num,charset encoding)

{
  _Elt_pointer pdVar1;
  _Map_pointer ppdVar2;
  _Elt_pointer pdVar3;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *line;
  _Elt_pointer line_00;
  token_base *local_88;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> tokens;
  
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::_Deque_base
            (&tokens.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>);
  process_char_buff(this,buff,
                    (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                    &tokens.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>,
                    encoding);
  local_88 = (token_base *)token_base::operator_new((token_base *)0x10,(size_t)buff);
  local_88->line_num = line_num;
  local_88->_vptr_token_base = (_func_int **)&PTR__token_base_00373e68;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::emplace_back<cs::token_base*>
            ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)&tokens,&local_88);
  process_token_buff(this,&tokens,ast);
  line_00 = (ast->
            super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            )._M_impl.super__Deque_impl_data._M_start._M_cur;
  pdVar3 = (ast->
           super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_last;
  ppdVar2 = (ast->
            super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            )._M_impl.super__Deque_impl_data._M_start._M_node;
  pdVar1 = (ast->
           super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  while (line_00 != pdVar1) {
    process_line(this,line_00);
    line_00 = line_00 + 1;
    if (line_00 == pdVar3) {
      line_00 = ppdVar2[1];
      ppdVar2 = ppdVar2 + 1;
      pdVar3 = line_00 + 6;
    }
  }
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
            (&tokens.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>);
  return;
}

Assistant:

void
		build_line(const std::deque<char> &buff, std::deque<std::deque<token_base *>> &ast, std::size_t line_num = 1,
		           charset encoding = charset::utf8)
		{
			std::deque<token_base *> tokens;
			process_char_buff(buff, tokens, encoding);
			tokens.push_back(new token_endline(line_num));
			process_token_buff(tokens, ast);
			for (auto &line: ast)
				process_line(line);
		}